

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

void ZSTD_ldm_adjustParameters(ldmParams_t *params,ZSTD_compressionParameters *cParams)

{
  U32 local_2c;
  U32 local_28;
  U32 local_24;
  uint local_20;
  U32 minMatch;
  ZSTD_compressionParameters *cParams_local;
  ldmParams_t *params_local;
  
  params->windowLog = cParams->windowLog;
  if (params->bucketSizeLog == 0) {
    params->bucketSizeLog = 3;
  }
  if (params->minMatchLength == 0) {
    params->minMatchLength = 0x40;
  }
  if (ZSTD_btlazy2 < cParams->strategy) {
    if (params->minMatchLength < cParams->targetLength) {
      local_20 = cParams->targetLength;
    }
    else {
      local_20 = params->minMatchLength;
    }
    params->minMatchLength = local_20;
  }
  if (params->hashLog == 0) {
    if (params->windowLog - 7 < 6) {
      local_24 = 6;
    }
    else {
      local_24 = params->windowLog - 7;
    }
    params->hashLog = local_24;
  }
  if (params->hashRateLog == 0) {
    if (params->windowLog < params->hashLog) {
      local_28 = 0;
    }
    else {
      local_28 = params->windowLog - params->hashLog;
    }
    params->hashRateLog = local_28;
  }
  if (params->bucketSizeLog < params->hashLog) {
    local_2c = params->bucketSizeLog;
  }
  else {
    local_2c = params->hashLog;
  }
  params->bucketSizeLog = local_2c;
  return;
}

Assistant:

void ZSTD_ldm_adjustParameters(ldmParams_t* params,
                               ZSTD_compressionParameters const* cParams)
{
    params->windowLog = cParams->windowLog;
    ZSTD_STATIC_ASSERT(LDM_BUCKET_SIZE_LOG <= ZSTD_LDM_BUCKETSIZELOG_MAX);
    DEBUGLOG(4, "ZSTD_ldm_adjustParameters");
    if (!params->bucketSizeLog) params->bucketSizeLog = LDM_BUCKET_SIZE_LOG;
    if (!params->minMatchLength) params->minMatchLength = LDM_MIN_MATCH_LENGTH;
    if (cParams->strategy >= ZSTD_btopt) {
      /* Get out of the way of the optimal parser */
      U32 const minMatch = MAX(cParams->targetLength, params->minMatchLength);
      assert(minMatch >= ZSTD_LDM_MINMATCH_MIN);
      assert(minMatch <= ZSTD_LDM_MINMATCH_MAX);
      params->minMatchLength = minMatch;
    }
    if (params->hashLog == 0) {
        params->hashLog = MAX(ZSTD_HASHLOG_MIN, params->windowLog - LDM_HASH_RLOG);
        assert(params->hashLog <= ZSTD_HASHLOG_MAX);
    }
    if (params->hashRateLog == 0) {
        params->hashRateLog = params->windowLog < params->hashLog
                                   ? 0
                                   : params->windowLog - params->hashLog;
    }
    params->bucketSizeLog = MIN(params->bucketSizeLog, params->hashLog);
}